

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<_IO_FILE*>(TreesIndexer *model,_IO_FILE **in)

{
  pointer pSVar1;
  SingleTreeIndex *tree;
  pointer node;
  size_t vec_size;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>(&vec_size,1,in);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize(&model->indices,vec_size)
    ;
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::_M_shrink_to_fit
              (&model->indices);
    pSVar1 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (node = (model->indices).
                super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                super__Vector_impl_data._M_start; node != pSVar1; node = node + 1) {
      deserialize_node<_IO_FILE*>(node,in);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t>(&vec_size, (size_t)1, in);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node(tree, in);
}